

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locbased.cpp
# Opt level: O0

void __thiscall
icu_63::LocaleBased::setLocaleIDs(LocaleBased *this,Locale *validID,Locale *actualID)

{
  char *pcVar1;
  char *pcVar2;
  Locale *actualID_local;
  Locale *validID_local;
  LocaleBased *this_local;
  
  pcVar1 = this->valid;
  pcVar2 = Locale::getName(validID);
  strcpy(pcVar1,pcVar2);
  pcVar1 = this->actual;
  pcVar2 = Locale::getName(actualID);
  strcpy(pcVar1,pcVar2);
  return;
}

Assistant:

void LocaleBased::setLocaleIDs(const Locale& validID, const Locale& actualID) {
  uprv_strcpy(valid, validID.getName());
  uprv_strcpy(actual, actualID.getName());
}